

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::InsertTypeTransitionsAtPotentialKills(BackwardPass *this)

{
  anon_class_32_4_2f3b0438 fn;
  anon_class_16_2_f7f4a3d9 fn_00;
  bool bVar1;
  PropertySym *pPVar2;
  SymID local_34;
  PropertySymOpnd *pPStack_30;
  SymID opndId;
  PropertySymOpnd *propertySymOpnd;
  Instr **local_20;
  Instr *local_18;
  Instr *instr;
  BackwardPass *this_local;
  
  local_18 = this->currentInstr;
  instr = (Instr *)this;
  bVar1 = IR::Instr::HasBailOutInfo(local_18);
  if ((bVar1) || (local_18->m_opcode == UpdateNewScObjectCache)) {
    local_20 = &local_18;
    fn_00.instr = local_20;
    fn_00.this = this;
    propertySymOpnd = (PropertySymOpnd *)this;
    ForEachAddPropertyCacheBucket<BackwardPass::InsertTypeTransitionsAtPotentialKills()::__0>
              (this,fn_00);
  }
  else {
    pPStack_30 = IR::Instr::GetPropertySymOpnd(local_18);
    if ((pPStack_30 != (PropertySymOpnd *)0x0) &&
       (bVar1 = IR::PropertySymOpnd::IsObjectHeaderInlined(pPStack_30), bVar1)) {
      pPVar2 = Sym::AsPropertySym((pPStack_30->super_SymOpnd).m_sym);
      local_34 = (pPVar2->m_stackSym->super_Sym).m_id;
      fn.propertySymOpnd = &stack0xffffffffffffffd0;
      fn.opndId = &local_34;
      fn.this = this;
      fn.instr = &local_18;
      ForEachAddPropertyCacheBucket<BackwardPass::InsertTypeTransitionsAtPotentialKills()::__1>
                (this,fn);
    }
  }
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionsAtPotentialKills()
{
    // Final types can't be pushed up past certain instructions.
    IR::Instr *instr = this->currentInstr;

    if (instr->HasBailOutInfo() || instr->m_opcode == Js::OpCode::UpdateNewScObjectCache)
    {
        // Final types can't be pushed up past a bailout point.
        // Insert any transitions called for by the current state of add-property buckets.
        // Also do this for ctor cache updates, to avoid putting a type in the ctor cache that extends past
        // the end of the ctor that the cache covers.
        this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
            this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
            return false;
        });
    }
    else
    {
        // If this is a load/store that expects an object-header-inlined type, don't push another sym's transition from
        // object-header-inlined to non-object-header-inlined type past it, because the two syms may be aliases.
        IR::PropertySymOpnd *propertySymOpnd = instr->GetPropertySymOpnd();
        if (propertySymOpnd && propertySymOpnd->IsObjectHeaderInlined())
        {
            SymID opndId = propertySymOpnd->m_sym->AsPropertySym()->m_stackSym->m_id;
            this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
                if ((SymID)symId == opndId)
                {
                    // This is the sym we're tracking. No aliasing to worry about.
                    return false;
                }
                if (propertySymOpnd->NeedsMonoCheck() && data->GetInitialType() != propertySymOpnd->GetType())
                {
                    // Type mismatch in a monomorphic case -- no aliasing.
                    return false;
                }
                if (this->TransitionUndoesObjectHeaderInlining(data))
                {
                    // We're transitioning from inlined to non-inlined, so we can't push it up any farther.
                    this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
                }
                return false;
            });
        }
    }
}